

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

Vec_Int_t * Ivy_ManLatches(Ivy_Man_t *p)

{
  Vec_Int_t *p_00;
  int *piVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = p->nObjs[4];
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar2 = iVar3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar2;
  iVar3 = 0;
  if (iVar2 == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)malloc((long)iVar2 << 2);
  }
  p_00->pArray = piVar1;
  for (; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
    piVar1 = (int *)Vec_PtrEntry(p->vObjs,iVar3);
    if ((piVar1 != (int *)0x0) && ((piVar1[2] & 0xfU) == 4)) {
      Vec_IntPush(p_00,*piVar1);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Ivy_ManLatches( Ivy_Man_t * p )
{
    Vec_Int_t * vLatches;
    Ivy_Obj_t * pObj;
    int i;
    vLatches = Vec_IntAlloc( Ivy_ManLatchNum(p) );
    Ivy_ManForEachLatch( p, pObj, i )
        Vec_IntPush( vLatches, pObj->Id );
    return vLatches;
}